

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bit_cost_t __thiscall
lzham::lzcompressor::state::get_len2_match_cost
          (state *this,CLZBase *lzbase,uint dict_pos,uint len2_match_dist,uint is_match_model_index)

{
  byte bVar1;
  uint uVar2;
  bit_cost_t bVar3;
  uint in_ECX;
  CLZBase *in_RSI;
  raw_quasi_adaptive_huffman_data_model *in_RDI;
  uint in_R8D;
  uint num_extra_bits;
  uint main_sym;
  uint match_high_sym;
  uint match_low_sym;
  uint match_len;
  uint match_extra;
  uint match_slot;
  bit_cost_t cost;
  uint in_stack_ffffffffffffffac;
  uint local_30;
  uint local_2c;
  bit_cost_t local_28;
  uint local_18;
  CLZBase *local_10;
  
  local_18 = in_ECX;
  local_10 = in_RSI;
  local_28 = adaptive_bit_model::get_cost
                       ((adaptive_bit_model *)
                        ((long)&(in_RDI->m_codes).m_capacity + (ulong)in_R8D * 2),1);
  bVar3 = adaptive_bit_model::get_cost
                    ((adaptive_bit_model *)
                     ((long)&in_RDI[0x13].m_code_sizes.m_capacity +
                     (ulong)*(uint *)((long)&(in_RDI->m_sym_freq).m_p + 4) * 2),0);
  local_28 = bVar3 + local_28;
  CLZBase::compute_lzx_position_slot(local_10,local_18,&local_2c,&local_30);
  bVar3 = raw_quasi_adaptive_huffman_data_model::get_cost(in_RDI,in_stack_ffffffffffffffac);
  local_28 = bVar3 + local_28;
  bVar1 = (local_10->super_CLZDecompBase).m_lzx_position_extra_bits[local_2c];
  uVar2 = (uint)bVar1;
  if (uVar2 < 3) {
    local_28 = (ulong)bVar1 * 0x1000000 + local_28;
  }
  else {
    if (4 < uVar2) {
      local_28 = (uVar2 - 4) * 0x1000000 + local_28;
    }
    bVar3 = raw_quasi_adaptive_huffman_data_model::get_cost(in_RDI,in_stack_ffffffffffffffac);
    local_28 = bVar3 + local_28;
  }
  return local_28;
}

Assistant:

bit_cost_t lzcompressor::state::get_len2_match_cost(CLZBase& lzbase, uint dict_pos, uint len2_match_dist, uint is_match_model_index)
   {
      dict_pos;

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(1);

      cost += m_is_rep_model[m_cur_state].get_cost(0);

      // full match
      uint match_slot, match_extra;
      lzbase.compute_lzx_position_slot(len2_match_dist, match_slot, match_extra);

      const uint match_len = 2;
      uint match_low_sym = match_len - 2;

      uint match_high_sym = 0;

      LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
      match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

      uint main_sym = match_low_sym | (match_high_sym << 3);

      cost += m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);

      uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
      if (num_extra_bits < 3)
         cost += (num_extra_bits << cBitCostScaleShift);
      else
      {
         if (num_extra_bits > 4)
            cost += ((num_extra_bits - 4) << cBitCostScaleShift);

         cost += m_dist_lsb_table.get_cost(match_extra & 15);
      }

      return cost;
   }